

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O0

string * util::lowercase(string *__return_storage_ptr__,string *str)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  string *str_local;
  string *ret;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)str);
  std::__cxx11::string::length();
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  uVar1 = std::__cxx11::string::cbegin();
  uVar2 = std::__cxx11::string::cend();
  uVar3 = std::__cxx11::string::begin();
  std::
  transform<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,util::lowercase(std::__cxx11::string_const&)::__0>
            (uVar1,uVar2,uVar3);
  return __return_storage_ptr__;
}

Assistant:

std::string lowercase(const std::string& str)
{
    std::string ret = str;
    ret.reserve(str.length());
    std::transform(str.cbegin(), str.cend(), ret.begin(), [](char c) {
        return static_cast<uint8_t>(std::tolower(static_cast<int>(c)));
        });
    return ret;
}